

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_8.cpp
# Opt level: O1

int reset(int x)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  if (x != 0) {
    do {
      iVar1 = x % 10 + iVar1 * 10;
      uVar2 = x + 9;
      x = x / 10;
    } while (0x12 < uVar2);
  }
  return iVar1;
}

Assistant:

int reset(int x) //把数字反转
{
    int num = 0;
    while (x)
    {
        num = num * 10 + x % 10;                    // 把一个数翻转过来，就只需要把每次求余的结果加上上一次求余结果*10
        x /= 10;                                    //除10，向前进一位处理
    }
    return num;
}